

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O0

wstring * __thiscall
Centaurus::NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>::get_entry_wide
          (wstring *__return_storage_ptr__,
          NFABase<Centaurus::NFABaseState<unsigned_char,_int>_> *this,wstring *prefix)

{
  wstring *prefix_local;
  NFABase<Centaurus::NFABaseState<unsigned_char,_int>_> *this_local;
  
  std::operator+(__return_storage_ptr__,prefix,L"_S0");
  return __return_storage_ptr__;
}

Assistant:

std::wstring get_entry_wide(const std::wstring& prefix) const
	{
		return prefix + L"_S0";
	}